

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Aig_Obj_t *
createArenaViolation
          (Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pWindowBegins,Aig_Obj_t *pWithinWindow,
          Vec_Ptr_t *vMasterBarriers,Vec_Ptr_t *vBarrierLo,Vec_Ptr_t *vBarrierLiDriver,
          Vec_Ptr_t *vMonotoneDisjunctionNodes)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  void *Entry;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  Vec_Ptr_t *vBarrierSignals;
  Aig_Obj_t *pObjArenaViolation;
  Aig_Obj_t *pObjBarrierSwitch;
  Aig_Obj_t *pObjBarrierLo;
  Aig_Obj_t *pObjAnd2;
  Aig_Obj_t *pObjOr1;
  Aig_Obj_t *pObjAnd1;
  Aig_Obj_t *pObj;
  int i;
  Aig_Obj_t *pWithinWindowLocal;
  Aig_Obj_t *pWindowBeginsLocal;
  Vec_Ptr_t *vBarrierLo_local;
  Vec_Ptr_t *vMasterBarriers_local;
  Aig_Obj_t *pWithinWindow_local;
  Aig_Obj_t *pWindowBegins_local;
  Aig_Man_t *pAigNew_local;
  Aig_Man_t *pAigOld_local;
  
  if (vBarrierLiDriver == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierLiDriver != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb6,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes == (Vec_Ptr_t *)0x0) {
    __assert_fail("vMonotoneDisjunctionNodes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb7,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  pAVar3 = Aig_ManConst1(pAigNew);
  vBarrierSignals = (Vec_Ptr_t *)Aig_Not(pAVar3);
  p = collectBarrierDisjunctions(pAigOld,pAigNew,vMasterBarriers);
  if (p == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierSignals != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbc,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  iVar1 = Vec_PtrSize(vMonotoneDisjunctionNodes);
  if (iVar1 != 0) {
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbe,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
    Entry = Vec_PtrEntry(p,pObj._4_4_);
    Vec_PtrPush(vMonotoneDisjunctionNodes,Entry);
  }
  iVar1 = Vec_PtrSize(vMonotoneDisjunctionNodes);
  iVar2 = Vec_PtrSize(vMasterBarriers);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xc1,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,pObj._4_4_);
    pAVar4 = Aig_And(pAigNew,pAVar3,pWindowBegins);
    p1 = (Aig_Obj_t *)Vec_PtrEntry(vBarrierLo,pObj._4_4_);
    pAVar4 = Aig_Or(pAigNew,pAVar4,p1);
    Vec_PtrPush(vBarrierLiDriver,pAVar4);
    pAVar3 = Aig_Xor(pAigNew,pAVar3,p1);
    pAVar3 = Aig_And(pAigNew,pAVar3,pWithinWindow);
    vBarrierSignals = (Vec_Ptr_t *)Aig_Or(pAigNew,pAVar3,(Aig_Obj_t *)vBarrierSignals);
  }
  Vec_PtrFree(p);
  return (Aig_Obj_t *)vBarrierSignals;
}

Assistant:

Aig_Obj_t *createArenaViolation(
		Aig_Man_t *pAigOld,
		Aig_Man_t *pAigNew, 
		Aig_Obj_t *pWindowBegins, 
		Aig_Obj_t *pWithinWindow, 
		Vec_Ptr_t *vMasterBarriers, 
		Vec_Ptr_t *vBarrierLo,
		Vec_Ptr_t *vBarrierLiDriver,
		Vec_Ptr_t *vMonotoneDisjunctionNodes
		)
{
	Aig_Obj_t *pWindowBeginsLocal = pWindowBegins;
	Aig_Obj_t *pWithinWindowLocal = pWithinWindow;
	int i;
	Aig_Obj_t *pObj, *pObjAnd1, *pObjOr1, *pObjAnd2, *pObjBarrierLo, *pObjBarrierSwitch, *pObjArenaViolation;
	Vec_Ptr_t *vBarrierSignals;

	assert( vBarrierLiDriver != NULL );
	assert( vMonotoneDisjunctionNodes != NULL );

	pObjArenaViolation = Aig_Not(Aig_ManConst1( pAigNew ));

	vBarrierSignals = collectBarrierDisjunctions(pAigOld, pAigNew, vMasterBarriers);
	assert( vBarrierSignals != NULL );

	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0 );
	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
		Vec_PtrPush( vMonotoneDisjunctionNodes, pObj );
	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers ) );

	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
	{
		//pObjNew = driverToPoNew( pAigOld, pObj );
		pObjAnd1 = Aig_And(pAigNew, pObj, pWindowBeginsLocal);
		pObjBarrierLo = (Aig_Obj_t *)Vec_PtrEntry( vBarrierLo, i );
		pObjOr1 = Aig_Or(pAigNew, pObjAnd1, pObjBarrierLo);
		Vec_PtrPush( vBarrierLiDriver, pObjOr1 );

		pObjBarrierSwitch = Aig_Xor( pAigNew, pObj, pObjBarrierLo );
		pObjAnd2 = Aig_And( pAigNew, pObjBarrierSwitch, pWithinWindowLocal );
		pObjArenaViolation = Aig_Or( pAigNew, pObjAnd2, pObjArenaViolation );
	}

	Vec_PtrFree(vBarrierSignals);
	return pObjArenaViolation;
}